

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathVec.h
# Opt level: O2

float __thiscall Imath_3_2::Vec3<float>::lengthTiny(Vec3<float> *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  uint uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  uVar1 = this->x;
  uVar2 = this->y;
  uVar3 = -(uint)((float)uVar1 < -(float)uVar1);
  uVar4 = -(uint)((float)uVar2 < -(float)uVar2);
  fVar6 = (float)(~uVar3 & uVar1 | (uint)-(float)uVar1 & uVar3);
  fVar7 = (float)(~uVar4 & uVar2 | (uint)-(float)uVar2 & uVar4);
  fVar5 = this->z;
  uVar3 = -(uint)(fVar5 < -fVar5);
  fVar8 = (float)(~uVar3 & (uint)fVar5 | (uint)-fVar5 & uVar3);
  fVar5 = fVar7;
  if (fVar7 <= fVar6) {
    fVar5 = fVar6;
  }
  fVar9 = fVar8;
  if (fVar8 <= fVar5) {
    fVar9 = fVar5;
  }
  fVar5 = 0.0;
  if ((fVar9 != 0.0) || (NAN(fVar9))) {
    fVar5 = SQRT((fVar8 / fVar9) * (fVar8 / fVar9) +
                 (fVar6 / fVar9) * (fVar6 / fVar9) + (fVar7 / fVar9) * (fVar7 / fVar9)) * fVar9;
  }
  return fVar5;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 inline T
Vec3<T>::lengthTiny () const IMATH_NOEXCEPT
{
    T absX = (x >= T (0)) ? x : -x;
    T absY = (y >= T (0)) ? y : -y;
    T absZ = (z >= T (0)) ? z : -z;

    T max = absX;

    if (max < absY) max = absY;

    if (max < absZ) max = absZ;

    if (IMATH_UNLIKELY (max == T (0))) return T (0);

    //
    // Do not replace the divisions by max with multiplications by 1/max.
    // Computing 1/max can overflow but the divisions below will always
    // produce results less than or equal to 1.
    //

    absX /= max;
    absY /= max;
    absZ /= max;

    return max * std::sqrt (absX * absX + absY * absY + absZ * absZ);
}